

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_reader<wchar_t,jsoncons::string_source<wchar_t>,std::allocator<char>>::
basic_json_reader<std::__cxx11::wstring_const&>
          (basic_json_reader<wchar_t,jsoncons::string_source<wchar_t>,std::allocator<char>> *this,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *source,
          basic_json_visitor<wchar_t> *visitor,basic_json_decode_options<wchar_t> *options,
          function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *err_handler,
          allocator<char> *temp_alloc)

{
  pointer pwVar1;
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> local_40;
  
  pwVar1 = (source->_M_dataplus)._M_p;
  *(pointer *)this = pwVar1;
  *(pointer *)(this + 8) = pwVar1;
  *(pointer *)(this + 0x10) = pwVar1 + source->_M_string_length;
  this[0x18] = (basic_json_reader<wchar_t,jsoncons::string_source<wchar_t>,std::allocator<char>>)0x1
  ;
  *(undefined ***)(this + 0x20) = &PTR__basic_json_visitor_009b1020;
  *(basic_json_visitor<wchar_t> **)(this + 0x28) = visitor;
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::function
            (&local_40,err_handler);
  basic_json_parser<wchar_t,_std::allocator<char>_>::basic_json_parser
            ((basic_json_parser<wchar_t,_std::allocator<char>_> *)(this + 0x30),options,&local_40,
             temp_alloc);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  return;
}

Assistant:

basic_json_reader(Sourceable&& source,
                          basic_json_visitor<CharT>& visitor, 
                          const basic_json_decode_options<CharT>& options,
                          std::function<bool(json_errc,const ser_context&)> err_handler, 
                          const TempAllocator& temp_alloc = TempAllocator())
           : source_(std::forward<Sourceable>(source)),
             visitor_(visitor),
             parser_(options,err_handler,temp_alloc)
        {
        }